

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O0

void __thiscall
cnn::SelectCols::forward_impl
          (SelectCols *this,vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,
          Tensor *fx)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  size_type sVar1;
  Block<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_true>
  *other;
  Block<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_true>
  *pBVar2;
  vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *in_RSI;
  Block<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_true>
  *in_RDI;
  uint i;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *cm;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> y;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> x;
  DenseBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_fffffffffffffef8;
  Tensor *in_stack_ffffffffffffff18;
  uint local_64;
  
  sVar1 = std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::size(in_RSI);
  if (sVar1 == 1) {
    std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::operator[](in_RSI,0);
    Tensor::operator*(in_stack_ffffffffffffff18);
    Tensor::operator*(in_stack_ffffffffffffff18);
    this_00 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
              in_RDI[1].
              super_BlockImpl<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_true,_Eigen::Dense>
              .
              super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_true,_true>
              .m_xpr.
              super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
              .
              super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
              .m_data;
    local_64 = 0;
    while( true ) {
      other = (Block<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_true>
               *)(ulong)local_64;
      pBVar2 = (Block<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_true>
                *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(this_00);
      if (pBVar2 <= other) break;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](this_00,(ulong)local_64);
      Eigen::
      DenseBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>_>::col
                (in_stack_fffffffffffffef8,(Index)in_RDI);
      Eigen::
      DenseBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>_>::col
                (in_stack_fffffffffffffef8,(Index)in_RDI);
      Eigen::
      Block<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_-1,_1,_true>
      ::operator=(in_RDI,other);
      local_64 = local_64 + 1;
    }
    return;
  }
  __assert_fail("xs.size() == 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/cnn/nodes.cc"
                ,0x45,
                "virtual void cnn::SelectCols::forward_impl(const vector<const Tensor *> &, Tensor &) const"
               );
}

Assistant:

void SelectCols::forward_impl(const vector<const Tensor*>& xs, Tensor& fx) const {
  assert(xs.size() == 1);
#ifdef HAVE_CUDA
  throw std::runtime_error("SelectCols not yet implemented for CUDA");
#else
  auto x = **xs[0];
  auto y = *fx;
  auto& cm = *pcols;
  for (unsigned i = 0; i < cm.size(); ++i)
    y.col(i) = x.col(cm[i]);
#endif
}